

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_models_md3.cpp
# Opt level: O3

void __thiscall FMD3Model::LoadGeometry(FMD3Model *this)

{
  uint uVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  ulong uVar5;
  MD3Triangle *pMVar6;
  MD3TexCoord *pMVar7;
  MD3Vertex *pMVar8;
  long lVar9;
  int j;
  long lVar10;
  MD3Surface *pMVar11;
  float *pfVar12;
  uint uVar13;
  char *pcVar14;
  FResourceFile **ppFVar15;
  undefined1 auVar16 [16];
  FMemLump lumpdata;
  char *local_90;
  undefined1 local_88 [32];
  FResourceFile **local_68;
  DWORD *local_60;
  DWORD *local_58;
  DWORD *local_50;
  double local_48;
  double local_40;
  double local_38;
  
  FWadCollection::ReadLump((FWadCollection *)local_88,0xaad1d0);
  local_88._24_8_ = SEXT48(this->numSurfaces);
  if (0 < (long)local_88._24_8_) {
    ppFVar15 = (FResourceFile **)0x0;
    if (*(int *)(local_88._0_8_ + -0xc) == 0) {
      local_88._0_8_ = ppFVar15;
    }
    local_90 = (char *)(local_88._0_8_ + (ulong)*(uint *)(local_88._0_8_ + 100));
    local_88._16_8_ = this->surfaces;
    local_88._12_4_ = this->numFrames;
    do {
      uVar4 = local_88._16_8_;
      uVar1 = *(uint *)(local_90 + 0x58);
      iVar2 = ((MD3Surface *)(local_88._16_8_ + ppFVar15 * 0x38))->numTriangles;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = (long)iVar2;
      uVar5 = SUB168(auVar16 * ZEXT816(0xc),0);
      local_60 = (DWORD *)(ulong)*(uint *)(local_90 + 0x68);
      if (SUB168(auVar16 * ZEXT816(0xc),8) != 0) {
        uVar5 = 0xffffffffffffffff;
      }
      pMVar6 = (MD3Triangle *)operator_new__(uVar5);
      pMVar11 = (MD3Surface *)(uVar4 + ppFVar15 * 0x38);
      pMVar11->tris = pMVar6;
      if (0 < iVar2) {
        pcVar14 = local_90 + uVar1;
        lVar9 = 0;
        do {
          lVar10 = 0;
          do {
            pMVar6->VertIndex[lVar10] = *(int *)(pcVar14 + lVar10 * 4);
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          lVar9 = lVar9 + 1;
          pMVar6 = pMVar6 + 1;
          pcVar14 = pcVar14 + 0xc;
        } while (lVar9 < iVar2);
      }
      uVar1 = *(uint *)(local_90 + 0x60);
      iVar2 = pMVar11->numVertices;
      lVar9 = (long)iVar2;
      uVar5 = lVar9 * 8;
      if (lVar9 < 0) {
        uVar5 = 0xffffffffffffffff;
      }
      local_68 = ppFVar15;
      pMVar7 = (MD3TexCoord *)operator_new__(uVar5);
      pMVar11->texcoords = pMVar7;
      if (0 < iVar2) {
        lVar10 = 0;
        do {
          pMVar7[lVar10] = *(MD3TexCoord *)(local_90 + lVar10 * 8 + (ulong)uVar1);
          lVar10 = lVar10 + 1;
        } while (lVar9 != lVar10);
      }
      uVar13 = iVar2 * local_88._12_4_;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (long)(int)uVar13;
      uVar5 = SUB168(auVar3 * ZEXT816(0x18),0);
      uVar1 = *(uint *)(local_90 + 100);
      if (SUB168(auVar3 * ZEXT816(0x18),8) != 0) {
        uVar5 = 0xffffffffffffffff;
      }
      pMVar8 = (MD3Vertex *)operator_new__(uVar5);
      pMVar11->vertices = pMVar8;
      if (0 < (int)uVar13) {
        pfVar12 = &pMVar8->nz;
        uVar5 = 0;
        do {
          auVar16 = pshuflw(ZEXT416(*(uint *)(local_90 + uVar5 * 8 + (ulong)uVar1)),
                            ZEXT416(*(uint *)(local_90 + uVar5 * 8 + (ulong)uVar1)),0x60);
          ((MD3Vertex *)(pfVar12 + -5))->x = (float)(auVar16._0_4_ >> 0x10) * 0.015625;
          ((MD3Vertex *)(pfVar12 + -5))->y = (float)(auVar16._4_4_ >> 0x10) * 0.015625;
          pfVar12[-3] = (float)(int)*(short *)(local_90 + uVar5 * 8 + (ulong)uVar1 + 4) * 0.015625;
          local_58 = (DWORD *)((double)(byte)*(ushort *)(local_90 + uVar5 * 8 + (ulong)uVar1 + 6) *
                              0.02454369260617026);
          sincos((double)(*(ushort *)(local_90 + uVar5 * 8 + (ulong)uVar1 + 6) >> 8) *
                 0.02454369260617026,&local_38,&local_40);
          sincos((double)local_58,&local_48,(double *)&local_50);
          *(ulong *)(pfVar12 + -2) =
               CONCAT44((float)(local_48 * local_38),(float)(local_48 * local_40));
          *pfVar12 = (float)(double)local_50;
          uVar5 = uVar5 + 1;
          pfVar12 = pfVar12 + 6;
        } while (uVar13 != uVar5);
      }
      local_90 = local_90 + (long)local_60;
      ppFVar15 = (FResourceFile **)((long)local_68 + 1);
    } while (ppFVar15 != (FResourceFile **)local_88._24_8_);
  }
  FMemLump::~FMemLump((FMemLump *)local_88);
  return;
}

Assistant:

void FMD3Model::LoadGeometry()
{
	FMemLump lumpdata = Wads.ReadLump(mLumpNum);
	const char *buffer = (const char *)lumpdata.GetMem();
	md3_header_t * hdr = (md3_header_t *)buffer;
	md3_surface_t * surf = (md3_surface_t*)(buffer + LittleLong(hdr->Ofs_Surfaces));

	for(int i=0;i<numSurfaces;i++)
	{
		MD3Surface * s = &surfaces[i];
		md3_surface_t * ss = surf;

		surf = (md3_surface_t *)(((char*)surf) + LittleLong(surf->Ofs_End));

		// copy triangle indices
		md3_triangle_t * tris = (md3_triangle_t*)(((char*)ss)+LittleLong(ss->Ofs_Triangles));
		s->tris = new MD3Triangle[s->numTriangles];

		for(int i=0;i<s->numTriangles;i++) for (int j=0;j<3;j++)
		{
			s->tris[i].VertIndex[j]=LittleLong(tris[i].vt_index[j]);
		}

		// Load texture coordinates
		md3_texcoord_t * tc = (md3_texcoord_t*)(((char*)ss)+LittleLong(ss->Ofs_Texcoord));
		s->texcoords = new MD3TexCoord[s->numVertices];

		for(int i=0;i<s->numVertices;i++)
		{
			s->texcoords[i].s = tc[i].s;
			s->texcoords[i].t = tc[i].t;
		}

		// Load vertices and texture coordinates
		md3_vertex_t * vt = (md3_vertex_t*)(((char*)ss)+LittleLong(ss->Ofs_XYZNormal));
		s->vertices = new MD3Vertex[s->numVertices * numFrames];

		for(int i=0;i<s->numVertices * numFrames;i++)
		{
			s->vertices[i].x = LittleShort(vt[i].x)/64.f;
			s->vertices[i].y = LittleShort(vt[i].y)/64.f;
			s->vertices[i].z = LittleShort(vt[i].z)/64.f;
			UnpackVector( LittleShort(vt[i].n), s->vertices[i].nx, s->vertices[i].ny, s->vertices[i].nz);
		}
	}
}